

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O1

chunk_conflict * town_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  ushort uVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint uVar4;
  wchar_t wVar5;
  uint32_t uVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  int iVar9;
  int iVar10;
  chunk_conflict *source;
  chunk *c;
  feature *pfVar11;
  square *psVar12;
  ulong uVar13;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ulong extraout_RAX;
  loc_conflict lVar14;
  wchar_t wVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  loc lVar20;
  int iVar21;
  loc grid;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  wchar_t wVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  loc lVar29;
  bool bVar30;
  bool bVar31;
  wchar_t lot_south;
  wchar_t lot_e;
  wchar_t lot_n;
  loc_conflict nw_corner;
  undefined4 uVar32;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 uVar33;
  undefined4 in_stack_fffffffffffffed4;
  ulong local_120;
  wchar_t local_118;
  wchar_t local_110;
  wchar_t local_10c;
  wchar_t local_108;
  wchar_t local_104;
  wchar_t local_100;
  wchar_t local_fc;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  loc_conflict local_d8;
  int local_cc;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  player *local_a8;
  wchar_t local_9c;
  wchar_t local_98;
  wchar_t local_94;
  uint local_90;
  uint local_8c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  uint local_5c;
  wchar_t local_58;
  wchar_t local_54;
  int local_50;
  int local_4c;
  loc_conflict local_48;
  loc local_40;
  ulong local_38;
  
  _Var2 = is_daytime();
  local_5c = (uint)(&z_info->town_monsters_day)[!_Var2];
  source = chunk_find_name("Town");
  c = (chunk *)cave_new((uint)z_info->town_hgt,(uint)z_info->town_wid);
  if (source == (chunk_conflict *)0x0) {
    c->depth = (int)p->depth;
    uVar3 = Rand_div(3);
    local_94 = (wchar_t)z_info->town_wid;
    draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x16',L'\0',
                   true);
    local_4c = uVar3 + 5;
    local_90 = 0;
    if (local_4c < 1) {
      local_4c = 0;
    }
    local_4c = local_4c + 1;
    local_40.x = L'\x01';
    local_40.y = L'\x01';
    local_c8 = 0x100000001;
    local_e0 = 0x100000001;
    local_80 = 0x100000001;
    local_9c = L'\0';
    local_98 = L'\0';
    local_38 = (ulong)uVar3;
    do {
      if (L'\x02' < c->height) {
        lVar19 = 1;
        lVar29 = local_40;
        do {
          if (L'\x02' < c->width) {
            lVar24 = 1;
            lVar20 = lVar29;
            do {
              square_set_feat((chunk_conflict *)c,lVar20,L'\x15');
              lVar24 = lVar24 + 1;
              lVar20 = (loc)((long)lVar20 + 1);
            } while (lVar24 < (long)c->width + -1);
          }
          lVar19 = lVar19 + 1;
          lVar29 = (loc)((long)lVar29 + 0x100000000);
        } while (lVar19 < (long)c->height + -1);
      }
      iVar17 = local_4c;
      if (-6 < (int)local_38) {
        do {
          build_streamer((chunk_conflict *)c,L'\x17',L'\0');
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      uVar33 = 0;
      uVar32 = 1;
      generate_starburst_room
                (c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',false,L'\x01',
                 false);
      if (L'\x02' < c->height) {
        lVar29.x = L'\x01';
        lVar29.y = L'\x01';
        lVar19 = 1;
        do {
          if (L'\x02' < c->width) {
            lVar24 = 1;
            lVar20 = lVar29;
            do {
              psVar12 = square((chunk_conflict *)c,lVar20);
              flag_off(psVar12->info,3,4);
              lVar24 = lVar24 + 1;
              lVar20 = (loc)((long)lVar20 + 1);
            } while (lVar24 < (long)c->width + -1);
          }
          lVar19 = lVar19 + 1;
          lVar29 = (loc)((long)lVar29 + 0x100000000);
        } while (lVar19 < (long)c->height + -1);
      }
      uVar1 = z_info->town_wid;
      uVar3 = Rand_div((uVar1 / 6) * 2 + 1);
      uVar18 = (uVar3 + (uVar1 >> 1)) - z_info->town_wid / 6;
      uVar26 = (ulong)uVar18;
      _Var2 = square_isfloor((chunk_conflict *)c,(loc)(uVar26 | 0x100000000));
      uVar28 = 1;
      if (!_Var2) {
        lVar29 = (loc)(uVar26 | 0x200000000);
        uVar28 = 1;
        do {
          if (z_info->town_hgt >> 2 <= uVar28) break;
          uVar28 = uVar28 + 1;
          _Var2 = square_isfloor((chunk_conflict *)c,lVar29);
          lVar29 = (loc)((long)lVar29 + 0x100000000);
        } while (!_Var2);
      }
      if ((uint)uVar28 < (uint)(z_info->town_hgt >> 2)) {
        iVar17 = uVar18 - 1;
        local_a8 = p;
        local_70 = uVar28;
        do {
          iVar27 = -1;
          do {
            iVar21 = (int)local_70 + iVar27;
            lVar29 = (loc)loc(iVar17,iVar21);
            _Var2 = square_isfiery((chunk_conflict *)c,lVar29);
            if (_Var2) {
              lVar29 = (loc)loc(iVar17,iVar21);
              square_set_feat((chunk_conflict *)c,lVar29,L'\x15');
            }
            iVar27 = iVar27 + 1;
          } while (iVar27 != 2);
          bVar30 = iVar17 <= (int)uVar18;
          iVar17 = iVar17 + 1;
        } while (bVar30);
        uVar1 = z_info->town_hgt;
        uVar3 = Rand_div((uint)(uVar1 >> 2));
        iVar27 = (uVar1 >> 1) - uVar3;
        uVar3 = Rand_div((uint)(z_info->town_hgt >> 3));
        uVar23 = uVar3 + iVar27;
        local_80 = (ulong)uVar23;
        iVar17 = (int)((ulong)((long)(int)uVar18 * -0x2aaaaaab) >> 0x20);
        local_88 = (ulong)(uint)(iVar17 - (iVar17 >> 0x1f));
        local_68 = (ulong)(uint)((int)(z_info->town_wid - uVar18) / 6);
        uVar4 = uVar3 + iVar27 + 3;
        if (-1 < (int)uVar23) {
          uVar4 = uVar23;
        }
        local_8c = -((int)uVar4 >> 2);
        iVar17 = z_info->town_hgt - uVar23;
        local_cc = iVar17 + 3;
        if (-1 < iVar17) {
          local_cc = iVar17;
        }
        local_cc = local_cc >> 2;
        bVar31 = z_info->store_max == 0;
        bVar30 = !bVar31;
        uVar13 = (ulong)CONCAT31((int3)((uint)iVar17 >> 8),bVar30);
        uVar16 = local_e0;
        p = local_a8;
        uVar22 = local_c8;
        local_78 = uVar26;
        if (bVar31) {
          local_b8 = CONCAT71(local_b8._1_7_,bVar30);
        }
        else {
          local_d8.y = uVar23;
          local_d8.x = uVar18;
          local_b0 = 0;
          local_b8 = CONCAT71(local_b8._1_7_,1);
          iVar17 = 0;
          do {
            bVar30 = 99 < iVar17;
            if (iVar17 < 100) {
              do {
                while( true ) {
                  iVar27 = iVar17;
                  uVar3 = Rand_div(2);
                  if (uVar3 == 0) {
                    uVar3 = Rand_div(2);
                    uVar4 = -(uint)(uVar3 == 0) | 1;
                    uVar18 = rand_range(local_8c,local_cc);
                  }
                  else {
                    uVar4 = rand_range((int)local_88,(int)local_68);
                    uVar3 = Rand_div(2);
                    uVar18 = -(uint)(uVar3 == 0) | 1;
                  }
                  uVar22 = (ulong)uVar4;
                  uVar16 = (ulong)uVar18;
                  if ((uVar18 == 0) || (uVar4 == 0)) break;
                  lVar14.y = uVar18;
                  lVar14.x = uVar4;
                  local_e0 = uVar16;
                  get_lot_bounds(local_d8,lVar14,(wchar_t)&local_100,(wchar_t)&local_fc,&local_108,
                                 &local_104,(int *)CONCAT44(in_stack_fffffffffffffecc,uVar32),
                                 (int *)CONCAT44(in_stack_fffffffffffffed4,uVar33));
                  wVar15 = local_fc;
                  wVar5 = local_104;
                  uVar13 = (ulong)(uint)(local_108 - local_100);
                  if (local_108 - local_100 < 5) {
                    bVar30 = false;
                  }
                  else {
                    uVar13 = (ulong)(uint)(local_104 - local_fc);
                    if (local_104 - local_fc < 3) {
                      bVar30 = false;
                    }
                    else {
                      bVar30 = true;
                      if (local_100 <= local_108) {
                        wVar7 = local_104 + L'\x01';
                        local_e8 = CONCAT44(local_e8._4_4_,local_108);
                        wVar25 = local_100;
                        local_c8 = uVar22;
                        do {
                          local_c0 = (ulong)(uint)wVar25;
                          wVar8 = wVar15;
                          if (wVar15 <= wVar5) {
                            do {
                              lVar20.y = wVar8;
                              lVar20.x = wVar25;
                              _Var2 = square_isfloor((chunk_conflict *)c,lVar20);
                              uVar13 = CONCAT71(extraout_var,_Var2);
                              if (!_Var2) {
                                bVar30 = false;
                                uVar22 = local_c8;
                                goto LAB_001492de;
                              }
                              wVar8 = wVar8 + L'\x01';
                            } while (wVar7 != wVar8);
                          }
                          wVar25 = (int)local_c0 + L'\x01';
                          uVar13 = (ulong)(uint)wVar25;
                          uVar22 = local_c8;
                        } while ((int)local_c0 != (int)local_e8);
                      }
                    }
                  }
LAB_001492de:
                  uVar16 = local_e0;
                  if ((bVar30) || (iVar17 = iVar27 + 1, 0x62 < iVar27)) goto LAB_0014936f;
                }
                uVar13 = 0;
                iVar17 = iVar27 + 1;
              } while (iVar27 < 99);
LAB_0014936f:
              bVar30 = 0x62 < iVar27;
              iVar17 = iVar27 + 1;
              p = local_a8;
            }
            if (!bVar30) {
              local_c0 = CONCAT44(local_c0._4_4_,iVar17);
              iVar17 = (int)uVar16;
              wVar5 = (int)local_80 + iVar17 * 4;
              if (local_9c <= wVar5) {
                local_9c = wVar5;
              }
              iVar27 = (int)uVar22;
              wVar5 = (int)local_78 + iVar27 * 6;
              if (wVar5 <= local_94) {
                local_94 = wVar5;
              }
              if (local_98 <= wVar5) {
                local_98 = wVar5;
              }
              get_lot_bounds(local_d8,(loc_conflict)(uVar22 & 0xffffffff | uVar16 << 0x20),
                             (wchar_t)&local_100,(wchar_t)&local_108,&local_10c,&local_110,
                             (int *)CONCAT44(in_stack_fffffffffffffecc,uVar32),
                             (int *)CONCAT44(in_stack_fffffffffffffed4,uVar33));
              wVar5 = local_100;
              wVar7 = local_108;
              wVar15 = local_10c;
              wVar25 = local_110;
              local_e0 = uVar16;
              local_c8 = uVar22;
              if (iVar27 - 2U < 0xfffffffd) {
                if (iVar17 == -1) {
                  local_118 = local_108 + L'\x01';
                  uVar3 = Rand_div(2);
                  if (local_118 < wVar25 - uVar3) {
                    uVar3 = Rand_div(2);
                    local_118 = wVar25 - uVar3;
                  }
                  local_120 = (ulong)(uint)local_118;
                  local_e8 = (ulong)(uint)(local_118 + L'\xfffffffe');
                }
                else {
                  uVar18 = local_110 + L'\xffffffff';
                  uVar3 = Rand_div(2);
                  if (uVar3 + wVar7 < (int)uVar18) {
                    uVar3 = Rand_div(2);
                    uVar18 = uVar3 + wVar7;
                  }
                  local_120 = (ulong)uVar18;
                  local_118 = uVar18 + L'\x02';
                  local_e8 = local_120;
                }
                wVar15 = local_100;
                wVar5 = local_10c;
                wVar7 = rand_range(local_100 + L'\x01',local_10c + L'\xfffffffe');
                wVar25 = wVar7 + L'\xfffffffe';
                if (wVar7 + L'\xfffffffe' < wVar15) {
                  wVar25 = wVar15;
                }
                wVar8 = rand_range(wVar25,wVar7);
                iVar17 = (int)local_120;
                lVar29 = (loc)loc(wVar8 + L'\xffffffff',iVar17);
                _Var2 = square_isfloor((chunk_conflict *)c,lVar29);
                wVar15 = wVar8 + L'\x01';
                wVar25 = wVar15;
                if (wVar15 < wVar7) {
                  wVar25 = wVar7;
                }
                if (_Var2) {
                  wVar25 = wVar7;
                  wVar15 = wVar8;
                }
                uVar26 = (ulong)(uint)wVar25;
                if (wVar25 + L'\x02' < wVar5) {
                  wVar5 = wVar25 + L'\x02';
                }
                wVar5 = rand_range(wVar15 + L'\x02',wVar5);
                iVar21 = wVar5 - wVar15;
joined_r0x00149937:
                if (1 < iVar21) {
                  lVar29 = (loc)loc(wVar5 + L'\x01',iVar17);
                  _Var2 = square_isfloor((chunk_conflict *)c,lVar29);
                  if ((!_Var2) && (wVar5 = wVar5 + L'\xffffffff', wVar5 <= (wchar_t)uVar26)) {
                    uVar26 = (ulong)(uint)wVar5;
                  }
                }
              }
              else if (iVar17 - 2U < 0xfffffffd) {
                if (iVar27 == -1) {
                  uVar18 = local_100 + L'\x01';
                  uVar3 = Rand_div(2);
                  uVar6 = Rand_div(2);
                  if ((int)uVar18 < wVar15 - (uVar6 + uVar3)) {
                    uVar3 = Rand_div(2);
                    uVar6 = Rand_div(2);
                    uVar18 = wVar15 - (uVar6 + uVar3);
                  }
                  uVar26 = (ulong)uVar18;
                  local_f0 = (ulong)(uVar18 - 2);
                  local_f8 = uVar26;
                }
                else {
                  uVar18 = local_10c + L'\xffffffff';
                  uVar3 = Rand_div(2);
                  uVar6 = Rand_div(2);
                  if (uVar6 + uVar3 + wVar5 < (int)uVar18) {
                    uVar3 = Rand_div(2);
                    uVar6 = Rand_div(2);
                    uVar18 = uVar6 + uVar3 + wVar5;
                  }
                  uVar26 = (ulong)uVar18;
                  local_f8 = (ulong)(uVar18 + 2);
                  local_f0 = uVar26;
                }
                wVar15 = local_108;
                wVar5 = local_110;
                wVar7 = rand_range(local_108,local_110 + L'\xffffffff');
                wVar25 = wVar7 + L'\xfffffffe';
                if (wVar7 + L'\xfffffffe' < wVar15) {
                  wVar25 = wVar15;
                }
                wVar8 = rand_range(wVar25,wVar7);
                lVar29 = (loc)loc((int)uVar26,wVar8 + L'\xffffffff');
                _Var2 = square_isfloor((chunk_conflict *)c,lVar29);
                wVar25 = wVar8 + L'\x01';
                wVar15 = wVar25;
                if (wVar25 < wVar7) {
                  wVar15 = wVar7;
                }
                if (_Var2) {
                  wVar25 = wVar8;
                }
                if (_Var2) {
                  wVar15 = wVar7;
                }
                local_120 = (ulong)(uint)wVar15;
                wVar7 = wVar25 + L'\x01';
                if (wVar25 + L'\x01' <= wVar15) {
                  wVar7 = wVar15;
                }
                wVar8 = wVar15 + L'\x02';
                if (wVar5 < wVar15 + L'\x02') {
                  wVar8 = wVar5;
                }
                local_118 = rand_range(wVar7,wVar8);
                local_e8 = (ulong)(uint)wVar25;
                if (local_118 - wVar25 < 2) {
                  wVar15 = (wchar_t)local_f0;
                  wVar5 = (wchar_t)local_f8;
                }
                else {
                  lVar29 = (loc)loc((int)uVar26,local_118 + L'\x01');
                  _Var2 = square_isfloor((chunk_conflict *)c,lVar29);
                  if (!_Var2) {
                    local_118 = local_118 + L'\xffffffff';
                    if (local_118 <= wVar15) {
                      local_120 = (ulong)(uint)local_118;
                    }
                  }
                  wVar15 = (wchar_t)local_f0;
                  wVar5 = (wchar_t)local_f8;
                }
              }
              else {
                if (iVar27 < 0) {
                  uVar3 = Rand_div(2);
                  wVar25 = ~uVar3 + wVar15;
                  uVar3 = Rand_div(2);
                  if (uVar3 + wVar25 < wVar15) {
                    uVar3 = Rand_div(2);
                    wVar15 = uVar3 + wVar25;
                  }
                  wVar5 = wVar25 + L'\xfffffffe';
                  if (wVar25 + L'\xfffffffe' < local_100) {
                    wVar5 = local_100;
                  }
                  wVar5 = rand_range(wVar5,wVar15 + L'\xfffffffe');
                }
                else {
                  uVar3 = Rand_div(2);
                  iVar17 = uVar3 + wVar5;
                  wVar25 = iVar17 + L'\x01';
                  uVar3 = Rand_div(2);
                  if (wVar5 < wVar25 - uVar3) {
                    uVar3 = Rand_div(2);
                    wVar5 = wVar25 - uVar3;
                  }
                  wVar15 = iVar17 + L'\x03';
                  if (local_10c < wVar15) {
                    wVar15 = local_10c;
                  }
                  wVar15 = rand_range(wVar5 + L'\x02',wVar15);
                }
                wVar8 = local_108;
                wVar7 = local_110;
                uVar26 = (ulong)(uint)wVar25;
                local_f0 = (ulong)(uint)wVar5;
                local_f8 = (ulong)(uint)wVar15;
                if ((long)(uVar16 << 0x20) < 0) {
                  uVar3 = Rand_div(2);
                  wVar7 = wVar7 - uVar3;
                  local_120 = (ulong)(uint)wVar7;
                  local_118 = wVar7;
                  if (wVar5 == wVar25 || wVar15 == wVar25) {
                    uVar3 = Rand_div(2);
                    local_118 = uVar3 + wVar7;
                  }
                  wVar5 = wVar7 + L'\xfffffffe';
                  if (wVar7 + L'\xfffffffe' < local_108) {
                    wVar5 = local_108;
                  }
                  wVar15 = (wchar_t)local_f0;
                  uVar28 = (ulong)(uint)wVar5;
                  if (local_118 - wVar5 < 2) goto LAB_001498b0;
                  lVar29 = (loc)loc(wVar25,wVar5 + L'\xffffffff');
                  _Var2 = square_isfloor((chunk_conflict *)c,lVar29);
                  local_e8 = (ulong)(uint)wVar5;
                  if (!_Var2) {
                    wVar5 = wVar5 + L'\x01';
                    local_e8 = (ulong)(uint)wVar5;
                    if (wVar7 < wVar5) {
                      local_120 = (ulong)(uint)wVar5;
                    }
                  }
                  wVar5 = (wchar_t)local_f8;
                }
                else {
                  uVar3 = Rand_div(2);
                  wVar8 = uVar3 + wVar8;
                  local_120 = (ulong)(uint)wVar8;
                  uVar28 = local_120;
                  if (wVar5 == wVar25 || wVar15 == wVar25) {
                    uVar3 = Rand_div(2);
                    uVar28 = (ulong)(uint)(wVar8 - uVar3);
                  }
                  local_118 = wVar8 + L'\x02';
                  if (local_110 < wVar8 + L'\x02') {
                    local_118 = local_110;
                  }
                  wVar15 = (wchar_t)local_f0;
                  if (local_118 - (int)uVar28 < 2) {
LAB_001498b0:
                    local_e8 = uVar28;
                    wVar5 = (wchar_t)local_f8;
                  }
                  else {
                    local_e8 = uVar28;
                    lVar29 = (loc)loc(wVar25,local_118 + L'\x01');
                    _Var2 = square_isfloor((chunk_conflict *)c,lVar29);
                    if ((!_Var2) && (local_118 = local_118 + L'\xffffffff', local_118 < wVar8)) {
                      local_120 = (ulong)(uint)local_118;
                    }
                    wVar5 = (wchar_t)local_f8;
                  }
                }
                iVar21 = wVar5 - wVar15;
                iVar17 = (int)local_120;
                if ((iVar27 < 0) && (1 < iVar21)) {
                  lVar29 = (loc)loc(wVar15 + L'\xffffffff',iVar17);
                  _Var2 = square_isfloor((chunk_conflict *)c,lVar29);
                  wVar5 = (wchar_t)local_f8;
                  if (!_Var2) {
                    wVar15 = wVar15 + L'\x01';
                    if (wVar25 <= wVar15) {
                      uVar26 = (ulong)(uint)wVar15;
                    }
                    goto LAB_0014996b;
                  }
                }
                if (0 < iVar27) goto joined_r0x00149937;
              }
LAB_0014996b:
              wVar25 = local_100;
              if (local_100 < wVar15) {
                wVar25 = wVar15;
              }
              wVar15 = local_10c;
              if (wVar5 < local_10c) {
                wVar15 = wVar5;
              }
              wVar5 = local_108;
              if (local_108 < (wchar_t)local_e8) {
                wVar5 = (wchar_t)local_e8;
              }
              wVar7 = local_110;
              if (local_118 < local_110) {
                wVar7 = local_118;
              }
              uVar32 = 0;
              fill_rectangle(c,wVar5,wVar25,wVar7,wVar15,L'\x16',L'\0');
              iVar17 = (int)local_b0;
              lVar19 = 0x21;
              wVar5 = L'\0';
              do {
                _Var2 = feat_is_shop(wVar5);
                uVar13 = CONCAT71(extraout_var_00,_Var2);
                if ((_Var2) && (uVar13 = 0, iVar17 + 1U == (uint)f_info->flags[lVar19 + -0x23])) {
                  square_set_feat((chunk_conflict *)c,(loc)(uVar26 | local_120 << 0x20),wVar5);
                  uVar13 = extraout_RAX;
                }
                lVar19 = lVar19 + 0x70;
                wVar5 = wVar5 + L'\x01';
              } while (lVar19 != 0xb11);
              uVar16 = local_e0;
              p = local_a8;
              uVar22 = local_c8;
              iVar17 = (wchar_t)local_c0;
            }
            if (bVar30) break;
            uVar18 = (int)local_b0 + 1;
            local_b0 = (ulong)uVar18;
            uVar13 = (ulong)z_info->store_max;
            bVar30 = uVar18 < z_info->store_max;
            local_b8 = CONCAT71(local_b8._1_7_,bVar30);
          } while (bVar30);
        }
        uVar26 = local_78;
        uVar28 = local_70;
        local_e0 = uVar16;
        local_c8 = uVar22;
        if ((local_b8 & 1) == 0) {
          local_90 = (uint)CONCAT71((int7)(uVar13 >> 8),1);
          if ((int)local_88 <= (int)local_68) {
            local_48 = (loc_conflict)(local_80 << 0x20 | local_78);
            uVar13 = local_88;
            iVar17 = local_cc;
            do {
              if (((int)uVar13 != 0) &&
                 (uVar16 = uVar13, uVar18 = local_8c, (int)local_8c <= iVar17)) {
                do {
                  local_88 = uVar16;
                  uVar22 = (ulong)uVar18;
                  if ((uVar18 != 0) &&
                     ((local_b8 = (ulong)uVar18, uVar3 = Rand_div(100), uVar22 = local_b8,
                      (int)uVar3 < 0x51 && (uVar3 = Rand_div(2), uVar22 = local_b8, uVar3 == 0)))) {
                    lVar14 = loc((int)uVar13,(int)local_b8);
                    get_lot_bounds(local_48,lVar14,(wchar_t)&local_100,(wchar_t)&local_fc,&local_108
                                   ,&local_104,(int *)CONCAT44(in_stack_fffffffffffffecc,uVar32),
                                   (int *)CONCAT44(in_stack_fffffffffffffed4,uVar33));
                    wVar5 = local_108;
                    bVar30 = local_100 <= local_108;
                    if (local_100 <= local_108) {
                      local_b0 = CONCAT44(local_b0._4_4_,local_fc);
                      local_d8.y = 0;
                      local_d8.x = local_104;
                      wVar25 = local_104 + L'\x01';
                      bVar30 = true;
                      wVar15 = local_100;
                      do {
                        wVar7 = (wchar_t)local_b0;
                        if ((wchar_t)local_b0 <= local_d8.x) {
                          do {
                            grid.y = wVar7;
                            grid.x = wVar15;
                            psVar12 = square((chunk_conflict *)c,grid);
                            _Var2 = feat_is_shop((uint)psVar12->feat);
                            if (_Var2) goto LAB_00149bfb;
                            wVar7 = wVar7 + L'\x01';
                          } while (wVar25 != wVar7);
                        }
                        bVar31 = wVar15 != wVar5;
                        bVar30 = wVar15 < wVar5;
                        wVar15 = wVar15 + L'\x01';
                      } while (bVar31);
                    }
LAB_00149bfb:
                    uVar13 = local_88;
                    p = local_a8;
                    uVar22 = local_b8;
                    uVar26 = local_78;
                    uVar28 = local_70;
                    iVar17 = local_cc;
                    if (!bVar30) {
                      lVar14 = loc((int)local_88,(int)local_b8);
                      get_lot_bounds(local_48,lVar14,(wchar_t)&local_100,(wchar_t)&local_108,
                                     &local_10c,&local_110,
                                     (int *)CONCAT44(in_stack_fffffffffffffecc,uVar32),
                                     (int *)CONCAT44(in_stack_fffffffffffffed4,uVar33));
                      wVar5 = local_110;
                      local_c0 = CONCAT44(local_c0._4_4_,local_10c);
                      local_f0 = CONCAT44(local_f0._4_4_,local_100);
                      uVar13 = local_88;
                      p = local_a8;
                      uVar22 = local_b8;
                      uVar26 = local_78;
                      uVar28 = local_70;
                      iVar17 = local_cc;
                      if (local_100 < local_10c) {
                        local_d8.x = local_108;
                        if (local_108 < local_110) {
                          iVar17 = rand_range(1,4);
                          iVar27 = rand_range(1,2);
                          iVar9 = rand_range(1,5 - iVar17);
                          iVar10 = rand_range(1,3 - iVar27);
                          wVar15 = iVar10 + iVar27 + wVar5 + L'\xfffffffc';
                          iVar21 = (wchar_t)local_c0;
                          iVar27 = (wchar_t)local_f0;
                          local_54 = iVar9 + (wchar_t)local_f0;
                          local_58 = iVar9 + iVar17 + (wchar_t)local_c0 + L'\xfffffffa';
                          uVar32 = 0;
                          local_b0 = CONCAT44(local_b0._4_4_,iVar10 + local_d8.x);
                          fill_rectangle(c,iVar10 + local_d8.x,local_54,wVar15,local_58,L'\x15',
                                         L'\0');
                          uVar13 = local_88;
                          p = local_a8;
                          uVar22 = local_b8;
                          uVar26 = local_78;
                          uVar28 = local_70;
                          iVar17 = local_cc;
                          if (iVar27 <= iVar21) {
                            wVar25 = (wchar_t)local_f0;
                            do {
                              if (local_d8.x <= wVar5) {
                                bVar30 = wVar25 < local_54;
                                bVar31 = local_58 < wVar25;
                                local_e8 = CONCAT71(local_e8._1_7_,
                                                    wVar25 == L'\x02' || (wchar_t)local_f0 < wVar25)
                                ;
                                local_f8 = CONCAT44(local_f8._4_4_,wVar25 + L'\xffffffff');
                                local_50 = wVar25 + L'\x01';
                                wVar7 = local_d8.x;
                                do {
                                  if ((wVar15 < wVar7) ||
                                     (wVar7 < (wchar_t)local_b0 || (bVar31 || bVar30))) {
                                    uVar3 = Rand_div(3);
                                    if (uVar3 == 0) {
                                      lVar29 = (loc)loc(wVar25,wVar7);
                                      _Var2 = square_isfloor((chunk_conflict *)c,lVar29);
                                      if (_Var2) {
                                        if ((char)local_e8 == '\0') {
                                          lVar29 = (loc)loc((int)local_f8,wVar7);
                                          _Var2 = square_isperm((chunk_conflict *)c,lVar29);
                                          if (_Var2) goto LAB_00149ef7;
                                        }
                                        if (((wchar_t)local_c0 <= wVar25) &&
                                           (wVar25 != (uint)z_info->town_wid + L'\xfffffffe')) {
                                          lVar29 = (loc)loc(local_50,wVar7);
                                          _Var2 = square_isperm((chunk_conflict *)c,lVar29);
                                          if (_Var2) goto LAB_00149ef7;
                                        }
                                        if (wVar7 != L'\x02' && wVar7 <= local_d8.x) {
                                          lVar29 = (loc)loc(wVar25,wVar7 + L'\xffffffff');
                                          _Var2 = square_isperm((chunk_conflict *)c,lVar29);
                                          if (_Var2) goto LAB_00149ef7;
                                        }
                                        wVar8 = L'\x18';
                                        if ((wVar5 <= wVar7) &&
                                           (wVar7 != (uint)z_info->town_hgt + L'\xfffffffe')) {
                                          lVar29 = (loc)loc(wVar25,wVar7 + L'\x01');
                                          _Var2 = square_isperm((chunk_conflict *)c,lVar29);
                                          if (_Var2) goto LAB_00149ef7;
                                        }
LAB_00149dd2:
                                        lVar29 = (loc)loc(wVar25,wVar7);
                                        square_set_feat((chunk_conflict *)c,lVar29,wVar8);
                                      }
                                    }
                                  }
                                  else {
                                    uVar3 = Rand_div(4);
                                    if (uVar3 == 0) {
                                      wVar8 = L'\x10';
                                      goto LAB_00149dd2;
                                    }
                                  }
LAB_00149ef7:
                                  wVar7 = wVar7 + L'\x01';
                                } while (wVar5 + L'\x01' != wVar7);
                              }
                              bVar30 = wVar25 != (wchar_t)local_c0;
                              uVar13 = local_88;
                              p = local_a8;
                              uVar22 = local_b8;
                              uVar26 = local_78;
                              uVar28 = local_70;
                              iVar17 = local_cc;
                              wVar25 = wVar25 + L'\x01';
                            } while (bVar30);
                          }
                        }
                      }
                    }
                  }
                  uVar16 = local_88;
                  uVar18 = (int)uVar22 + 1;
                } while ((int)uVar22 != iVar17);
              }
              iVar27 = (int)uVar13;
              uVar13 = (ulong)(iVar27 + 1);
            } while (iVar27 != (int)local_68);
          }
        }
      }
    } while ((local_90 & 1) == 0);
    iVar17 = (int)uVar26;
    lVar29 = (loc)loc(iVar17,(int)uVar28 + 1);
    square_set_feat((chunk_conflict *)c,lVar29,L'\x01');
    fill_rectangle(c,(int)uVar28 + L'\x02',iVar17 + L'\xffffffff',local_9c,iVar17 + L'\x01',L'\x01',
                   L'\0');
    fill_rectangle(c,(wchar_t)local_80,local_94,(wchar_t)local_80 + L'\x01',local_98,L'\x01',L'\0');
    lVar29 = (loc)(uVar28 << 0x20 | uVar26);
    square_set_feat((chunk_conflict *)c,lVar29,L'\x06');
  }
  else {
    c->depth = source->depth;
    _Var2 = chunk_copy((chunk_conflict *)c,p,source,L'\0',L'\0',L'\0',false);
    if (!_Var2) {
      quit_fmt("chunk_copy() level bounds failed!");
    }
    chunk_list_remove("Town");
    cave_free(source);
    if (c->height < L'\x01') {
      lVar19 = 0;
      uVar26 = 0;
    }
    else {
      lVar24 = 0;
      lVar19 = 0;
      do {
        if (c->width < L'\x01') {
          uVar26 = 0;
        }
        else {
          uVar26 = 0;
          do {
            pfVar11 = square_feat((chunk_conflict *)c,(loc)(lVar24 + uVar26));
            if (pfVar11->fidx == L'\x06') goto LAB_00149ff5;
            uVar26 = uVar26 + 1;
          } while ((long)uVar26 < (long)c->width);
        }
        lVar19 = lVar19 + 1;
        lVar24 = lVar24 + 0x100000000;
      } while (lVar19 < c->height);
    }
LAB_00149ff5:
    lVar29 = (loc)(uVar26 & 0xffffffff | lVar19 << 0x20);
  }
  player_place((chunk_conflict2 *)c,p,(loc_conflict)lVar29);
  _Var2 = is_daytime();
  cave_illuminate(c,_Var2);
  for (uVar18 = local_5c; uVar18 != 0; uVar18 = uVar18 - 1) {
    pick_and_place_distant_monster(c,p->grid,L'\x03',true,c->depth);
  }
  return (chunk_conflict *)c;
}

Assistant:

struct chunk *town_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i;
	struct loc grid;
	int residents = is_daytime() ? z_info->town_monsters_day :
		z_info->town_monsters_night;
	struct chunk *c_new, *c_old = chunk_find_name("Town");

	/* Make a new chunk */
	c_new = cave_new(z_info->town_hgt, z_info->town_wid);

	/* First time */
	if (!c_old) {
		c_new->depth = p->depth;

		/* Build stuff */
		town_gen_layout(c_new, p);
	} else {
		/* Copy from the chunk list, remove the old one */
		c_new->depth = c_old->depth;
		if (!chunk_copy(c_new, p, c_old, 0, 0, 0, 0))
			quit_fmt("chunk_copy() level bounds failed!");
		chunk_list_remove("Town");
		cave_free(c_old);

		/* Find the stairs (lame) */
		for (grid.y = 0; grid.y < c_new->height; grid.y++) {
			bool found = false;
			for (grid.x = 0; grid.x < c_new->width; grid.x++) {
				if (square_feat(c_new, grid)->fidx == FEAT_MORE) {
					found = true;
					break;
				}
			}
			if (found) break;
		}

		/* Place the player */
		player_place(c_new, p, grid);
	}

	/* Apply illumination */
	cave_illuminate(c_new, is_daytime());

	/* Make some residents */
	for (i = 0; i < residents; i++) {
		pick_and_place_distant_monster(c_new, p->grid, 3, true,
			c_new->depth);
	}

	return c_new;
}